

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::EnumOptions::MergePartialFromCodedStream
          (EnumOptions *this,CodedInputStream *input)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RAX;
  Type *value;
  uint8 *puVar3;
  uint32 tag;
  uint32 temp;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    while( true ) {
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
        input->last_tag_ = tag;
        input->buffer_ = puVar3 + 1;
      }
      else {
        tag = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = tag;
      }
      if (tag == 0) {
        return true;
      }
      uVar2 = tag & 7;
      if (tag >> 3 != 999) break;
      if (uVar2 == 2) goto LAB_001f83e6;
LAB_001f83a9:
      if (uVar2 == 4) {
        return true;
      }
      if (tag < 8000) {
        bVar1 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
      }
      else {
        bVar1 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,tag,input,default_instance_,&this->_unknown_fields_);
      }
      if (bVar1 == false) {
        return false;
      }
    }
    if ((tag >> 3 != 2) || (uVar2 != 0)) goto LAB_001f83a9;
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)((long)&uStack_38 + 4));
    if (!bVar1) {
      return false;
    }
    this->allow_alias_ = uStack_38._4_4_ != 0;
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
    puVar3 = input->buffer_;
    if (((1 < *(int *)&input->buffer_end_ - (int)puVar3) && (*puVar3 == 0xba)) && (puVar3[1] == '>')
       ) {
      do {
        input->buffer_ = puVar3 + 2;
LAB_001f83e6:
        value = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::UninterpretedOption>(input,value);
        if (!bVar1) {
          return false;
        }
        puVar3 = input->buffer_;
      } while (((1 < *(int *)&input->buffer_end_ - (int)puVar3) && (*puVar3 == 0xba)) &&
              (puVar3[1] == '>'));
      bVar1 = io::CodedInputStream::ExpectAtEnd(input);
      if (bVar1) {
        return true;
      }
    }
  } while( true );
}

Assistant:

bool EnumOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool allow_alias = 2 [default = true];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &allow_alias_)));
          set_has_allow_alias();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}